

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::remove
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,char *__filename)

{
  int iVar1;
  bool bVar2;
  undefined4 in_EAX;
  undefined3 extraout_var;
  undefined4 extraout_EAX;
  int i;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  lVar3 = 0;
  do {
    iVar1 = this->num_elements;
    if (iVar1 <= lVar3) {
LAB_0016f8ab:
      return CONCAT31((int3)((uint)in_EAX >> 8),lVar3 < iVar1);
    }
    bVar2 = CSkins::CSkin::operator==
                      ((CSkin *)(this->list->m_aName + lVar4 + -4),(CSkin *)__filename);
    in_EAX = CONCAT31(extraout_var,bVar2);
    if (bVar2) {
      remove_index(this,(int)lVar3);
      in_EAX = extraout_EAX;
      goto LAB_0016f8ab;
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 200;
  } while( true );
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}